

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalRightDelimJoin::GetLocalSinkState
          (PhysicalRightDelimJoin *this,ExecutionContext *context)

{
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  pointer pRVar3;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> local_28;
  _Head_base<0UL,_duckdb::RightDelimJoinLocalState_*,_false> local_20;
  
  make_uniq<duckdb::RightDelimJoinLocalState>();
  (*(code *)((((context[5].thread)->profiler).context)->config).ordered_aggregate_threshold)
            (&local_28);
  pRVar3 = unique_ptr<duckdb::RightDelimJoinLocalState,_std::default_delete<duckdb::RightDelimJoinLocalState>,_true>
           ::operator->((unique_ptr<duckdb::RightDelimJoinLocalState,_std::default_delete<duckdb::RightDelimJoinLocalState>,_true>
                         *)&local_20);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (LocalSinkState *)0x0;
  _Var1._M_head_impl =
       (pRVar3->join_state).
       super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
       super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
       .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
  (pRVar3->join_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (LocalSinkState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))();
    if (local_28._M_head_impl != (LocalSinkState *)0x0) {
      (*(local_28._M_head_impl)->_vptr_LocalSinkState[1])();
    }
  }
  (**(code **)&((context[5].pipeline.ptr)->super_enable_shared_from_this<duckdb::Pipeline>).
               __weak_this_.internal.super___weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr[1].ready)(&local_28);
  pRVar3 = unique_ptr<duckdb::RightDelimJoinLocalState,_std::default_delete<duckdb::RightDelimJoinLocalState>,_true>
           ::operator->((unique_ptr<duckdb::RightDelimJoinLocalState,_std::default_delete<duckdb::RightDelimJoinLocalState>,_true>
                         *)&local_20);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (LocalSinkState *)0x0;
  _Var1._M_head_impl =
       (pRVar3->distinct_state).
       super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
       super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
       .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
  (pRVar3->distinct_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (LocalSinkState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))();
    if (local_28._M_head_impl != (LocalSinkState *)0x0) {
      (*(local_28._M_head_impl)->_vptr_LocalSinkState[1])();
    }
  }
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalRightDelimJoin::GetLocalSinkState(ExecutionContext &context) const {
	auto state = make_uniq<RightDelimJoinLocalState>();
	state->join_state = join.GetLocalSinkState(context);
	state->distinct_state = distinct.GetLocalSinkState(context);
	return std::move(state);
}